

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  int64_t iVar2;
  bool bVar3;
  __optional_ne_t<long,_long> _Var4;
  int iVar5;
  uint64_t uVar6;
  int64_t iVar7;
  char *pcVar8;
  iterator iVar9;
  iterator last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  long *plVar10;
  pair<long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar11;
  pair<unsigned_long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar12;
  int64_t local_420;
  DumpUnitType local_414;
  DumpUnitType local_410;
  DumpUnitType local_40c;
  long local_320;
  long local_318;
  _Storage<long,_true> local_310;
  _Storage<long,_true> local_308;
  __unspec local_2f9;
  int local_2f8;
  type local_2f1;
  long local_2f0;
  _Storage<long,_true> local_2e8;
  _Storage<long,_true> local_2e0;
  long local_2d8;
  _Storage<long,_true> local_2d0;
  _Storage<long,_true> local_2c8;
  __unspec local_2b9;
  int local_2b8;
  type local_2b1;
  long local_2b0;
  _Storage<long,_true> local_2a8;
  _Storage<long,_true> local_2a0;
  long local_298;
  _Storage<long,_true> local_290;
  _Storage<long,_true> local_288;
  long local_280;
  _Storage<long,_true> local_278;
  _Storage<long,_true> local_270;
  long local_268;
  _Storage<long,_true> local_260;
  _Storage<long,_true> _Stack_258;
  long local_250;
  _Storage<long,_true> local_248 [2];
  int local_234;
  int64_t local_230;
  int64_t llFileSize;
  iterator iStack_220;
  bool fromStdin;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  unsigned_long local_210;
  pair<unsigned_long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res3;
  pair<unsigned_long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res2;
  pair<long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res1;
  int64_t local_1a8;
  _Storage<long,_true> local_1a0;
  _Storage<long,_true> local_198;
  int64_t local_190;
  _Storage<long,_true> local_188;
  _Storage<long,_true> local_180;
  int64_t local_178;
  _Storage<long,_true> local_170 [2];
  int64_t local_160;
  _Storage<long,_true> local_158;
  _Storage<long,_true> local_150;
  ArgIterator *local_148;
  ArgIterator *arg;
  ArgIterator __end1;
  ArgIterator __begin1;
  ArgParser local_e0;
  ArgParser *local_d0;
  ArgParser *__range1;
  undefined1 local_c0 [4];
  int argsfound;
  string crcspec;
  undefined1 local_98 [4];
  int nDumpUnitSize;
  string dstFilename;
  string srcFilename;
  optional<long> llBaseOffset;
  optional<long> llLength;
  optional<long> llEndOffset;
  optional<long> llOffset;
  char **argv_local;
  int argc_local;
  
  std::optional<long>::optional
            ((optional<long> *)
             &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged);
  std::optional<long>::optional
            ((optional<long> *)
             &llLength.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged);
  std::optional<long>::optional
            ((optional<long> *)
             &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged);
  std::optional<long>::optional((optional<long> *)((long)&srcFilename.field_2 + 8));
  std::__cxx11::string::string((string *)(dstFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_98);
  crcspec.field_2._12_4_ = 1;
  std::__cxx11::string::string((string *)local_c0);
  __range1._4_4_ = 0;
  ArgParser::ArgParser(&local_e0,argc,argv);
  local_d0 = &local_e0;
  ArgParser::begin((ArgIterator *)&__end1.longmatch,local_d0);
  ArgParser::end((ArgIterator *)&arg,local_d0);
  while (bVar3 = operator!=((ArgIterator *)&__end1.longmatch,(ArgIterator *)&arg), bVar3) {
    local_148 = ArgParser::ArgIterator::operator*((ArgIterator *)&__end1.longmatch);
    iVar5 = ArgParser::ArgIterator::option(local_148);
    switch(iVar5) {
    default:
      usage();
      argv_local._4_4_ = 1;
      goto LAB_00109302;
    case 0x31:
    case 0x32:
    case 0x34:
    case 0x38:
      iVar5 = ArgParser::ArgIterator::option(local_148);
      crcspec.field_2._12_4_ = iVar5 + -0x30;
      break;
    case 0x53:
      uVar6 = ArgParser::ArgIterator::getuint(local_148);
      g_summarizeThreshold = (int)uVar6;
      break;
    case 0x61:
      g_dumpformat = DUMP_STRINGS;
      break;
    case 0x62:
      local_160 = ArgParser::ArgIterator::getint(local_148);
      std::optional<long>::optional<long,_true>((optional<long> *)&local_158,&local_160);
      srcFilename.field_2._8_8_ = local_158;
      llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload = local_150;
      break;
    case 99:
      bVar3 = ArgParser::ArgIterator::match(local_148,"-crc");
      if (bVar3) {
        g_dumpformat = DUMP_CRC32;
        pcVar8 = ArgParser::ArgIterator::getstr(local_148);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   pcVar8);
      }
      else {
        g_dumpformat = DUMP_RAW;
      }
      break;
    case 0x65:
      local_190 = ArgParser::ArgIterator::getint(local_148);
      std::optional<long>::optional<long,_true>((optional<long> *)&local_188,&local_190);
      llLength.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _8_8_ = local_188;
      llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload = local_180;
      break;
    case 0x66:
      g_fulldump = true;
      break;
    case 0x68:
      g_dumpformat = DUMP_HASHES;
      break;
    case 0x6c:
      local_1a8 = ArgParser::ArgIterator::getint(local_148);
      std::optional<long>::optional<long,_true>((optional<long> *)&local_1a0,&local_1a8);
      llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = local_1a0;
      llLength.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload = local_198;
      break;
    case 0x6d:
      bVar3 = ArgParser::ArgIterator::match(local_148,"-md5");
      if (bVar3) {
        g_dumpformat = DUMP_HASH;
        g_hashtype = 1;
      }
      else {
        bVar3 = ArgParser::ArgIterator::match(local_148,"-md4");
        if (bVar3) {
          g_dumpformat = DUMP_HASH;
          g_hashtype = 0;
        }
        else {
          bVar3 = ArgParser::ArgIterator::match(local_148,"-md160");
          if (bVar3) {
            g_dumpformat = DUMP_HASH;
            g_hashtype = 6;
          }
        }
      }
      break;
    case 0x6f:
      local_178 = ArgParser::ArgIterator::getint(local_148);
      std::optional<long>::optional<long,_true>((optional<long> *)local_170,&local_178);
      llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = local_170[0];
      break;
    case 0x72:
      bVar3 = ArgParser::ArgIterator::match(local_148,"-ripemd160");
      if (bVar3) {
        g_dumpformat = DUMP_HASH;
        g_hashtype = 6;
      }
      else {
        uVar6 = ArgParser::ArgIterator::getuint(local_148);
        g_chunksize = (uint32_t)uVar6;
      }
      break;
    case 0x73:
      bVar3 = ArgParser::ArgIterator::match(local_148,"-sha256");
      if (bVar3) {
        g_dumpformat = DUMP_HASH;
        g_hashtype = 3;
      }
      else {
        bVar3 = ArgParser::ArgIterator::match(local_148,"-sha384");
        if (bVar3) {
          g_dumpformat = DUMP_HASH;
          g_hashtype = 4;
        }
        else {
          bVar3 = ArgParser::ArgIterator::match(local_148,"-sha512");
          if (bVar3) {
            g_dumpformat = DUMP_HASH;
            g_hashtype = 5;
          }
          else {
            bVar3 = ArgParser::ArgIterator::match(local_148,"-sum");
            if (bVar3) {
              g_dumpformat = DUMP_SUM;
            }
            else {
              g_llStepSize = ArgParser::ArgIterator::getint(local_148);
            }
          }
        }
      }
      break;
    case 0x77:
      iVar7 = ArgParser::ArgIterator::getint(local_148);
      g_nMaxUnitsPerLine = (int)iVar7;
      break;
    case 0x78:
      iVar5 = ArgParser::ArgIterator::count(local_148);
      if (iVar5 == 2) {
        g_dumpformat = DUMP_ASCII;
      }
      else {
        g_dumpformat = DUMP_HEX;
      }
      break;
    case -1:
    case 0:
      iVar5 = __range1._4_4_ + 1;
      if (__range1._4_4_ == 0) {
        __range1._4_4_ = iVar5;
        pcVar8 = ArgParser::ArgIterator::getstr(local_148);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dstFilename.field_2 + 8),pcVar8);
      }
      else {
        bVar3 = __range1._4_4_ == 1;
        __range1._4_4_ = iVar5;
        if (bVar3) {
          pcVar8 = ArgParser::ArgIterator::getstr(local_148);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     pcVar8);
        }
      }
    }
    ArgParser::ArgIterator::operator++((ArgIterator *)&__end1.longmatch);
  }
  if ((__range1._4_4_ == 0) || (2 < __range1._4_4_)) {
    usage();
    argv_local._4_4_ = 1;
    goto LAB_00109302;
  }
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  pVar12.second._M_current = (char *)res3.first;
  pVar12.first = g_crc_bits;
  if (!bVar3) {
    iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
    last = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0)
    ;
    pVar11 = parsesigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )iVar9._M_current,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )last._M_current,0);
    res1.first = (long)pVar11.second._M_current;
    g_crc_initval = pVar11.first;
    res2.second._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    bVar3 = __gnu_cxx::
            operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&res1,&res2.second);
    pVar12.second._M_current = (char *)res3.first;
    pVar12.first = g_crc_bits;
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      first = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&res1,1);
      iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0);
      pVar12 = parseunsigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )iVar9._M_current,0);
      res2.first = (unsigned_long)pVar12.second._M_current;
      g_crc_poly = pVar12.first;
      res3.second._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
      bVar3 = __gnu_cxx::
              operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&res2,&res3.second);
      pVar12.second._M_current = (char *)res3.first;
      pVar12.first = g_crc_bits;
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        local_218 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&res2,1);
        iStack_220 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c0);
        pVar12 = parseunsigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           (local_218,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )iStack_220._M_current,0);
        local_210 = pVar12.first;
      }
    }
  }
  res3.first = (unsigned_long)pVar12.second._M_current;
  g_crc_bits = pVar12.first;
  if (g_nMaxUnitsPerLine < 0) {
    if (g_dumpformat == DUMP_ASCII) {
      g_nMaxUnitsPerLine = (int)(0x40 / (long)(int)crcspec.field_2._12_4_);
    }
    else if (g_dumpformat == DUMP_HEX) {
      g_nMaxUnitsPerLine = (int)(0x20 / (long)(int)crcspec.field_2._12_4_);
    }
    else if ((int)g_dumpformat < 5) {
      g_nMaxUnitsPerLine = (int)(0x10 / (long)(int)crcspec.field_2._12_4_);
    }
    else {
      g_nMaxUnitsPerLine = (int)g_llStepSize;
    }
  }
  if (crcspec.field_2._12_4_ == 1) {
    local_40c = DUMPUNIT_BYTE;
  }
  else {
    if (crcspec.field_2._12_4_ == 2) {
      local_410 = DUMPUNIT_WORD;
    }
    else {
      if (crcspec.field_2._12_4_ == 4) {
        local_414 = DUMPUNIT_DWORD;
      }
      else {
        local_414 = DUMPUNIT_BYTE;
        if (crcspec.field_2._12_4_ == 8) {
          local_414 = DUMPUNIT_QWORD;
        }
      }
      local_410 = local_414;
    }
    local_40c = local_410;
  }
  g_dumpunit = local_40c;
  llFileSize._7_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&dstFilename.field_2 + 8),"-");
  if ((bool)llFileSize._7_1_) {
    local_420 = -1;
  }
  else {
    local_420 = GetFileSize((string *)((long)&dstFilename.field_2 + 8));
  }
  local_230 = local_420;
  bVar3 = std::optional::operator_cast_to_bool((optional *)(srcFilename.field_2._M_local_buf + 8));
  if (!bVar3) {
    local_234 = 0;
    std::optional<long>::operator=((optional<long> *)((long)&srcFilename.field_2 + 8),&local_234);
  }
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_engaged);
  if (bVar3) {
    plVar10 = std::optional<long>::value
                        ((optional<long> *)
                         &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_engaged);
    if (*plVar10 < 0) {
      if (((llFileSize._7_1_ & 1) != 0) || (local_230 < 0)) {
        printf("dumping end of stdin stream not yet implemented\n");
        argv_local._4_4_ = 1;
        goto LAB_00109302;
      }
      plVar10 = std::optional<long>::value((optional<long> *)((long)&srcFilename.field_2 + 8));
      lVar1 = *plVar10;
      plVar10 = std::optional<long>::value
                          ((optional<long> *)
                           &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged);
      local_250 = lVar1 + *plVar10 + local_230;
      std::optional<long>::optional<long,_true>((optional<long> *)local_248,&local_250);
      llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = local_248[0];
    }
  }
  else {
    llEndOffset.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._8_8_ = srcFilename.field_2._8_8_;
  }
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_engaged);
  if ((bVar3) ||
     (bVar3 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &llLength.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_engaged), bVar3)) {
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional *)
                       &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_engaged);
    if ((bVar3) ||
       (bVar3 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &llLength.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged), !bVar3)) {
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_engaged);
      if ((!bVar3) ||
         (bVar3 = std::optional::operator_cast_to_bool
                            ((optional *)
                             &llLength.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged), bVar3)) {
        plVar10 = std::optional<long>::value
                            ((optional<long> *)
                             &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        lVar1 = *plVar10;
        plVar10 = std::optional<long>::value
                            ((optional<long> *)
                             &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        local_320 = lVar1 + *plVar10;
        _Var4 = std::operator!=((optional<long> *)
                                &llLength.super__Optional_base<long,_true,_true>._M_payload.
                                 super__Optional_payload_base<long>._M_engaged,&local_320);
        if (_Var4) {
          printf("inconsistent use of -l, -o and -e\n");
          argv_local._4_4_ = 1;
          goto LAB_00109302;
        }
      }
      else {
        local_2f8 = 0;
        local_2f1 = (type)std::operator<=><long,_int>
                                    ((optional<long> *)
                                     &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload
                                      .super__Optional_payload_base<long>._M_engaged,&local_2f8);
        std::__cmp_cat::__unspec::__unspec(&local_2f9,(__unspec *)0x0);
        bVar3 = std::operator<(local_2f1);
        if (bVar3) {
          printf("Can\'t use negative length\n");
          argv_local._4_4_ = 1;
          goto LAB_00109302;
        }
        plVar10 = std::optional<long>::value
                            ((optional<long> *)
                             &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        lVar1 = *plVar10;
        plVar10 = std::optional<long>::value
                            ((optional<long> *)
                             &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        local_318 = lVar1 + *plVar10;
        std::optional<long>::optional<long,_true>((optional<long> *)&local_310,&local_318);
        llLength.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._8_8_ = local_310;
        llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload = local_308;
      }
    }
    else {
      local_2b8 = 0;
      local_2b1 = (type)std::operator<=><long,_int>
                                  ((optional<long> *)
                                   &llLength.super__Optional_base<long,_true,_true>._M_payload.
                                    super__Optional_payload_base<long>._M_engaged,&local_2b8);
      std::__cmp_cat::__unspec::__unspec(&local_2b9,(__unspec *)0x0);
      bVar3 = std::operator<(local_2b1);
      if (bVar3) {
        if (((llFileSize._7_1_ & 1) != 0) || (local_230 < 0)) {
          printf("Can\'t use negative offsets, on stdin\n");
          argv_local._4_4_ = 1;
          goto LAB_00109302;
        }
        plVar10 = std::optional<long>::value
                            ((optional<long> *)
                             &llLength.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        local_2d8 = *plVar10 + local_230;
        std::optional<long>::optional<long,_true>((optional<long> *)&local_2d0,&local_2d8);
        llLength.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._8_8_ = local_2d0;
        llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload = local_2c8;
      }
      plVar10 = std::optional<long>::value
                          ((optional<long> *)
                           &llLength.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged);
      lVar1 = *plVar10;
      plVar10 = std::optional<long>::value
                          ((optional<long> *)
                           &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged);
      local_2f0 = lVar1 - *plVar10;
      std::optional<long>::optional<long,_true>((optional<long> *)&local_2e8,&local_2f0);
      llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = local_2e8;
      llLength.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload = local_2e0;
    }
  }
  else if (local_230 < 0) {
    local_298 = 0x7fffffffffffffff;
    std::optional<long>::optional<long,_true>((optional<long> *)&local_290,&local_298);
    llLength.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = local_290;
    llEndOffset.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._M_payload = local_288;
    local_2b0 = 0x7fffffffffffffff;
    std::optional<long>::optional<long,_true>((optional<long> *)&local_2a8,&local_2b0);
    llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._8_8_ = local_2a8;
    llLength.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload = local_2a0;
  }
  else {
    plVar10 = std::optional<long>::value((optional<long> *)((long)&srcFilename.field_2 + 8));
    local_268 = *plVar10 + local_230;
    std::optional<long>::optional<long,_true>((optional<long> *)&local_260,&local_268);
    llLength.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = local_260;
    llEndOffset.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._M_payload = _Stack_258;
    plVar10 = std::optional<long>::value
                        ((optional<long> *)
                         &llLength.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_engaged);
    lVar1 = *plVar10;
    plVar10 = std::optional<long>::value
                        ((optional<long> *)
                         &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_engaged);
    local_280 = lVar1 - *plVar10;
    std::optional<long>::optional<long,_true>((optional<long> *)&local_278,&local_280);
    llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._8_8_ = local_278;
    llLength.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload = local_270;
  }
  plVar10 = std::optional<long>::value
                      ((optional<long> *)
                       &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_engaged);
  lVar1 = *plVar10;
  plVar10 = std::optional<long>::value((optional<long> *)((long)&srcFilename.field_2 + 8));
  if (lVar1 < *plVar10) {
    printf("offset must be >= baseoffset\n");
    argv_local._4_4_ = 1;
  }
  else {
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
    if (bVar3) {
      if (g_llStepSize == 0) {
        plVar10 = std::optional<long>::value((optional<long> *)((long)&srcFilename.field_2 + 8));
        iVar7 = *plVar10;
        plVar10 = std::optional<long>::value
                            ((optional<long> *)
                             &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        iVar2 = *plVar10;
        plVar10 = std::optional<long>::value
                            ((optional<long> *)
                             &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        Dumpfile((string *)((long)&dstFilename.field_2 + 8),iVar7,iVar2,*plVar10);
      }
      else {
        plVar10 = std::optional<long>::value((optional<long> *)((long)&srcFilename.field_2 + 8));
        iVar7 = *plVar10;
        plVar10 = std::optional<long>::value
                            ((optional<long> *)
                             &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        iVar2 = *plVar10;
        plVar10 = std::optional<long>::value
                            ((optional<long> *)
                             &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_engaged);
        StepFile((string *)((long)&dstFilename.field_2 + 8),iVar7,iVar2,*plVar10);
      }
    }
    else if (g_llStepSize == 0) {
      plVar10 = std::optional<long>::value((optional<long> *)((long)&srcFilename.field_2 + 8));
      iVar7 = *plVar10;
      plVar10 = std::optional<long>::value
                          ((optional<long> *)
                           &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged);
      iVar2 = *plVar10;
      plVar10 = std::optional<long>::value
                          ((optional<long> *)
                           &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged);
      Copyfile((string *)((long)&dstFilename.field_2 + 8),(string *)local_98,iVar7,iVar2,*plVar10);
    }
    else {
      plVar10 = std::optional<long>::value((optional<long> *)((long)&srcFilename.field_2 + 8));
      iVar7 = *plVar10;
      plVar10 = std::optional<long>::value
                          ((optional<long> *)
                           &llEndOffset.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged);
      iVar2 = *plVar10;
      plVar10 = std::optional<long>::value
                          ((optional<long> *)
                           &llBaseOffset.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged);
      CopyFileSteps((string *)((long)&dstFilename.field_2 + 8),(string *)local_98,iVar7,iVar2,
                    *plVar10);
    }
    argv_local._4_4_ = 0;
  }
LAB_00109302:
  res1.second._M_current._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(dstFilename.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    std::optional<int64_t> llOffset;
    std::optional<int64_t> llEndOffset;
    std::optional<int64_t> llLength;
    std::optional<int64_t> llBaseOffset;

    std::string srcFilename;
    std::string dstFilename;
    int nDumpUnitSize = 1;
    std::string crcspec;

    int argsfound = 0; 

    for (auto& arg : ArgParser(argc, argv))
        switch(arg.option())
        {
            case 'b': llBaseOffset = arg.getint(); break;
            case 'o': llOffset = arg.getint(); break;
            case 'e': llEndOffset = arg.getint(); break;
            case 'l': llLength = arg.getint(); break;

            case 'h': g_dumpformat= DUMP_HASHES; break;
            case 'r': 
#if !defined(__ANDROID__)
#ifdef RIPEMD160_DIGEST_LENGTH
                      if (arg.match("-ripemd160")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::RIPEMD160;
                      }
                      else
#endif
#endif
 
                      g_chunksize = arg.getuint(); break;

            case 'w': g_nMaxUnitsPerLine = arg.getint(); break;
            case 's': if (0)
                          ;
#ifdef SHA1_DIGEST_LENGTH
                      else if (arg.match("-sha1")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA1;
                      }
#endif
#if !defined(__ANDROID__)
#ifdef SHA256_DIGEST_LENGTH
                      else if (arg.match("-sha256")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA256;
                      }
#endif
#ifdef SHA384_DIGEST_LENGTH
                      else if (arg.match("-sha384")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA384;
                      }
#endif
#ifdef SHA512_DIGEST_LENGTH
                      else if (arg.match("-sha512")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA512;
                      }
#endif
#endif

                      else if (arg.match("-sum"))
                          g_dumpformat= DUMP_SUM;
                      else
                          g_llStepSize = arg.getint();
                      break;
            case 'm': if (0)
                          ;
#ifdef MD5_DIGEST_LENGTH
                      else if (arg.match("-md5")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD5;
                      }
#endif
#ifdef MD2_DIGEST_LENGTH
                      else if (arg.match("-md2")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD2;
                      }
#endif
#ifdef MD4_DIGEST_LENGTH
                      else if (arg.match("-md4")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD4;
                      }
#endif
#if !defined(__ANDROID__)
#ifdef RIPEMD160_DIGEST_LENGTH
                      else if (arg.match("-md160")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::RIPEMD160;
                      }
#endif
#endif

                      break;
            case 'a': g_dumpformat= DUMP_STRINGS; break;
            case 'c': if (arg.match("-crc")) {
                          g_dumpformat= DUMP_CRC32; 
                          crcspec = arg.getstr();
                      }
                      else
                          g_dumpformat= DUMP_RAW; 
                      break;
            case 'f': g_fulldump= true; break;
            case 'S': g_summarizeThreshold = arg.getuint(); break;
            case 'x': if (arg.count()==2)
                          g_dumpformat= DUMP_ASCII; 
                      else
                          g_dumpformat= DUMP_HEX; 
                      break;
            case '1': case '2': case '4': case '8':
                nDumpUnitSize= arg.option()-'0';
                break;
            case 0: // single '-'
            case -1:
                switch (argsfound++) {
                    case 0: srcFilename= arg.getstr(); break;
                    case 1: dstFilename= arg.getstr(); break;
                }
                break;

            default:
                usage();
                return 1;
        }
    if (argsfound==0 || argsfound>2)
    {
        usage();
        return 1;
    }

    if (!crcspec.empty()) {
        auto res1 = parsesigned(crcspec.begin(), crcspec.end(), 0);
        g_crc_initval= res1.first;
        if (res1.second!=crcspec.end()) {
            auto res2 = parseunsigned(res1.second+1, crcspec.end(), 0);
            g_crc_poly= res2.first;
            if (res2.second!=crcspec.end()) {
                auto res3 = parseunsigned(res2.second+1, crcspec.end(), 0);
                g_crc_bits= res3.first;

            }
        }
    }

    // 64 = highest 2^n, such that addrsize + 2^n <= screenwidth
    // 32 = highest 2^n, such that addrsize + 3*2^n <= screenwidth+25 ...
    // 16 = highest 2^n, such that addrsize + 4*2^n <= screenwidth
    if (g_nMaxUnitsPerLine<0) {
        if (g_dumpformat==DUMP_ASCII) 
            g_nMaxUnitsPerLine= 64/nDumpUnitSize;
        else if (g_dumpformat==DUMP_HEX) 
            g_nMaxUnitsPerLine= 32/nDumpUnitSize;
        else if (g_dumpformat>=DUMP_HASH)
            g_nMaxUnitsPerLine= g_llStepSize;
        else
            g_nMaxUnitsPerLine= 16/nDumpUnitSize;
    }

    g_dumpunit= 
        nDumpUnitSize==1?DUMPUNIT_BYTE:
        nDumpUnitSize==2?DUMPUNIT_WORD:
        nDumpUnitSize==4?DUMPUNIT_DWORD:
        nDumpUnitSize==8?DUMPUNIT_QWORD:DUMPUNIT_BYTE;

    if (g_dumpformat==DUMP_RAW) {
#ifdef WIN32
        if (-1==_setmode( _fileno( stdout ), _O_BINARY )) {
            print("ERROR: _setmode(stdout, rb)");
            return 1;
        }
#endif
    }

    bool fromStdin= srcFilename=="-";

    int64_t llFileSize= fromStdin ? -1 : GetFileSize(srcFilename);

    if (!llBaseOffset)
        llBaseOffset = 0;

    // determine start
    if (!llOffset)
        llOffset = llBaseOffset;
    else if (llOffset.value() < 0) {
        if (fromStdin || llFileSize < 0) {
            printf("dumping end of stdin stream not yet implemented\n");
            return 1;
        }
        llOffset = llBaseOffset.value() + llOffset.value() + llFileSize;
    }

    // determine end
    if (!llLength && !llEndOffset)
    {
        if (llFileSize >= 0) {
            llEndOffset = llBaseOffset.value() + llFileSize;
            llLength = llEndOffset.value() - llOffset.value();
        }
        // else: filesize, length unknown - until EOF.
        else {
            llEndOffset = INT64_MAX;
            llLength = INT64_MAX;
        }
    }
    else if (!llLength && llEndOffset) {
        if (llEndOffset < 0) {
            if (fromStdin || llFileSize < 0) {
                printf("Can't use negative offsets, on stdin\n");
                return 1;
            }
            llEndOffset = llEndOffset.value() + llFileSize;
        }
        llLength = llEndOffset.value() - llOffset.value();
    }
    else if (llLength && !llEndOffset) {
        if (llLength < 0) {
            printf("Can't use negative length\n");
            return 1;
        }
        llEndOffset = llOffset.value() + llLength.value();
    }
    else {
        if (llEndOffset != llOffset.value() + llLength.value()) {
            printf("inconsistent use of -l, -o and -e\n");
            return 1;
        }
    }

    if (llOffset.value() < llBaseOffset.value()) {
        printf("offset must be >= baseoffset\n");
        return 1;
    }


    if (!dstFilename.empty()) {
        if (g_llStepSize)
            CopyFileSteps(srcFilename, dstFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
        else
            Copyfile(srcFilename, dstFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
    }
    else {
        if (g_llStepSize)
            StepFile(srcFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
        else
            Dumpfile(srcFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
    }

    return 0;
}